

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void aom_hadamard_16x16_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int in_stack_00000294;
  tran_low_t *in_stack_00000298;
  ptrdiff_t in_stack_000002a0;
  int16_t *in_stack_000002a8;
  
  hadamard_16x16_sse2(in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000294);
  return;
}

Assistant:

void aom_hadamard_16x16_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  hadamard_16x16_sse2(src_diff, src_stride, coeff, 1);
}